

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

Value * duckdb::CustomProfilingSettingsSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  undefined8 uVar1;
  ClientConfig *pCVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  _Hash_node_base *p_Var4;
  string profiling_settings_str;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  long local_110;
  undefined1 local_108 [40];
  undefined1 local_e0 [16];
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_108._16_8_ = __return_storage_ptr__;
  pCVar2 = ClientConfig::GetConfig(context);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  local_110 = 0;
  local_108[0] = 0;
  p_Var4 = (pCVar2->profiler_settings)._M_h._M_before_begin._M_nxt;
  local_118 = params;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      if (local_110 != 0) {
        ::std::__cxx11::string::append((char *)&local_118);
      }
      local_70[0] = local_60;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"\"%s\": \"true\"","");
      pcVar3 = EnumUtil::ToChars<duckdb::MetricsType>(*(MetricsType *)&p_Var4[1]._M_nxt);
      ::std::__cxx11::string::string((string *)&local_90,pcVar3,&local_119);
      StringUtil::Format<std::__cxx11::string>
                ((string *)(local_108 + 0x18),(StringUtil *)local_70,&local_90,params);
      ::std::__cxx11::string::_M_append((char *)&local_118,local_108._24_8_);
      if ((undefined1 *)local_108._24_8_ != local_e0) {
        operator_delete((void *)local_108._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  local_b0[0] = local_a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"{%s}","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_118,(long)&(local_118->_M_dataplus)._M_p + local_110);
  StringUtil::Format<std::__cxx11::string>(&local_50,(StringUtil *)local_b0,&local_d0,params);
  uVar1 = local_108._16_8_;
  Value::Value((Value *)local_108._16_8_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108) {
    operator_delete(local_118);
  }
  return (Value *)uVar1;
}

Assistant:

Value CustomProfilingSettingsSetting::GetSetting(const ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);

	string profiling_settings_str;
	for (auto &entry : config.profiler_settings) {
		if (!profiling_settings_str.empty()) {
			profiling_settings_str += ", ";
		}
		profiling_settings_str += StringUtil::Format("\"%s\": \"true\"", EnumUtil::ToString(entry));
	}
	return Value(StringUtil::Format("{%s}", profiling_settings_str));
}